

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand32.c
# Opt level: O2

float frand32(void)

{
  g_seed = g_seed * 0x19660d + 0x3c6ef35f;
  return (float)(g_seed & 0x7fffff | 0x3f800000) + -1.0;
}

Assistant:

float frand32()
{
#if USE_IEEE_754 

    union 
	{ 
		uint32_t i; 
		float    f; 
	} pun;

    pun.i = 0x3f800000UL | (rand32() & 0x007fffffUL);
    return pun.f - 1.0f;

#else

    static const float ONE_OVER_MAX_UINT32 = 1.0f / 0xffffffffUL;

    return rand32() * ONE_OVER_MAX_UINT32;

#endif
}